

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t c4::base64_decode(csubstr encoded,blob data)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  error_flags eVar4;
  uint uVar5;
  ulong in_RCX;
  size_t in_RDX;
  char *in_RSI;
  c4 *in_RDI;
  csubstr encoded_00;
  uint32_t val_2;
  uint32_t val_1;
  uint32_t val;
  size_t rpos;
  uint32_t full_byte;
  char *d;
  size_t wpos;
  char *local_78;
  c4 *local_68;
  ulong local_60;
  size_t local_8;
  
  encoded_00.len = in_RDX;
  encoded_00.str = in_RSI;
  bVar2 = base64_valid(in_RDI,encoded_00);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    handle_error(0x347f4b,(char *)0x45ef,"check failed: %s","base64_valid(encoded)");
  }
  if (((ulong)in_RSI & 3) != 0) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    handle_error(0x347f4b,(char *)0x45f0,"check failed: %s","encoded.len % 4 == 0");
  }
  local_60 = 0;
  local_78 = (char *)0x0;
  local_68 = in_RDI;
  do {
    if (in_RSI <= local_78) {
LAB_002dad6e:
      if (local_68 == in_RDI + (long)in_RSI) {
        local_8 = local_60;
      }
      else {
        if (local_68[2] == (c4)0x3d) {
          if (local_68 + 4 != in_RDI + (long)in_RSI) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x460a,"check failed: %s",
                         "d + 4 == encoded.str + encoded.len");
          }
          if (local_68[3] != (c4)0x3d) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x460b,"check failed: %s","d[3] == \'=\'");
          }
          if ((char)local_68[1] < '\0') {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x460d,"check failed: %s","d[1] >= 0");
          }
          if (0x7f < (byte)local_68[1]) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x460d,"check failed: %s",
                         "size_t(d[1]) < sizeof(detail::base64_char_to_sextet_)");
          }
          cVar1 = detail::base64_char_to_sextet_[(char)local_68[1]];
          if ((char)*local_68 < '\0') {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x460e,"check failed: %s","d[0] >= 0");
          }
          if (0x7f < (byte)*local_68) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x460e,"check failed: %s",
                         "size_t(d[0]) < sizeof(detail::base64_char_to_sextet_)");
          }
          if (local_60 < in_RCX) {
            *(byte *)(in_RDX + local_60) =
                 (byte)((uint)((int)(char)detail::base64_char_to_sextet_[(char)*local_68] << 0x12)
                       >> 0x10) | (byte)((uint)((int)cVar1 << 0xc) >> 0x10);
          }
          local_60 = local_60 + 1;
        }
        else if (local_68[3] == (c4)0x3d) {
          if (local_68 + 4 != in_RDI + (long)in_RSI) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x4613,"check failed: %s",
                         "d + 4 == encoded.str + encoded.len");
          }
          if ((char)local_68[2] < '\0') {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x4615,"check failed: %s","d[2] >= 0");
          }
          if (0x7f < (byte)local_68[2]) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x4615,"check failed: %s",
                         "size_t(d[2]) < sizeof(detail::base64_char_to_sextet_)");
          }
          cVar1 = detail::base64_char_to_sextet_[(char)local_68[2]];
          if ((char)local_68[1] < '\0') {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x4616,"check failed: %s","d[1] >= 0");
          }
          if (0x7f < (byte)local_68[1]) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x4616,"check failed: %s",
                         "size_t(d[1]) < sizeof(detail::base64_char_to_sextet_)");
          }
          uVar5 = (int)(char)detail::base64_char_to_sextet_[(char)local_68[1]] << 0xc |
                  (int)cVar1 << 6;
          if ((char)*local_68 < '\0') {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x4617,"check failed: %s","d[0] >= 0");
          }
          if (0x7f < (byte)*local_68) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              trap_instruction();
            }
            handle_error(0x347f4b,(char *)0x4617,"check failed: %s",
                         "size_t(d[0]) < sizeof(detail::base64_char_to_sextet_)");
          }
          if (local_60 < in_RCX) {
            *(byte *)(in_RDX + local_60) =
                 (byte)((uint)((int)(char)detail::base64_char_to_sextet_[(char)*local_68] << 0x12)
                       >> 0x10) | (byte)(uVar5 >> 0x10);
          }
          if (local_60 + 1 < in_RCX) {
            *(char *)(in_RDX + local_60 + 1) = (char)(uVar5 >> 8);
          }
          local_60 = local_60 + 2;
        }
        local_8 = local_60;
      }
      return local_8;
    }
    if ((local_68[2] == (c4)0x3d) || (local_68[3] == (c4)0x3d)) {
      if (local_68 + 4 != in_RDI + (long)in_RSI) {
        eVar4 = get_error_flags();
        if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        handle_error(0x347f4b,(char *)0x45f9,"check failed: %s","d + 4 == encoded.str + encoded.len"
                    );
      }
      goto LAB_002dad6e;
    }
    if ((char)local_68[3] < '\0') {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x347f4b,(char *)0x45fd,"check failed: %s","d[3] >= 0");
    }
    if (0x7f < (byte)local_68[3]) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x347f4b,(char *)0x45fd,"check failed: %s",
                   "size_t(d[3]) < sizeof(detail::base64_char_to_sextet_)");
    }
    cVar1 = detail::base64_char_to_sextet_[(char)local_68[3]];
    if ((char)local_68[2] < '\0') {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x347f4b,(char *)0x45fe,"check failed: %s","d[2] >= 0");
    }
    if (0x7f < (byte)local_68[2]) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x347f4b,(char *)0x45fe,"check failed: %s",
                   "size_t(d[2]) < sizeof(detail::base64_char_to_sextet_)");
    }
    uVar5 = (int)(char)detail::base64_char_to_sextet_[(char)local_68[2]] << 6 | (int)cVar1;
    if ((char)local_68[1] < '\0') {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x347f4b,(char *)0x45ff,"check failed: %s","d[1] >= 0");
    }
    if (0x7f < (byte)local_68[1]) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x347f4b,(char *)0x45ff,"check failed: %s",
                   "size_t(d[1]) < sizeof(detail::base64_char_to_sextet_)");
    }
    uVar3 = (int)(char)detail::base64_char_to_sextet_[(char)local_68[1]] << 0xc | uVar5;
    if ((char)*local_68 < '\0') {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x347f4b,(char *)0x4600,"check failed: %s","d[0] >= 0");
    }
    if (0x7f < (byte)*local_68) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      handle_error(0x347f4b,(char *)0x4600,"check failed: %s",
                   "size_t(d[0]) < sizeof(detail::base64_char_to_sextet_)");
    }
    if (local_60 < in_RCX) {
      *(byte *)(in_RDX + local_60) =
           (byte)((uint)((int)(char)detail::base64_char_to_sextet_[(char)*local_68] << 0x12) >> 0x10
                 ) | (byte)(uVar3 >> 0x10);
    }
    if (local_60 + 1 < in_RCX) {
      *(char *)(in_RDX + local_60 + 1) = (char)(uVar3 >> 8);
    }
    if (local_60 + 2 < in_RCX) {
      *(char *)(in_RDX + local_60 + 2) = (char)uVar5;
    }
    local_60 = local_60 + 3;
    local_78 = local_78 + 4;
    local_68 = local_68 + 4;
  } while( true );
}

Assistant:

size_t base64_decode(csubstr encoded, blob data)
{
    #define c4append_(c) { if(wpos < data.len) { data.buf[wpos] = static_cast<c4::byte>(c); } ++wpos; }
    #define c4appendval_(c, shift)\
    {\
        C4_XASSERT(c >= 0);\
        C4_XASSERT(size_t(c) < sizeof(detail::base64_char_to_sextet_));\
        val |= static_cast<uint32_t>(detail::base64_char_to_sextet_[(c)]) << ((shift) * 6);\
    }

    C4_ASSERT(base64_valid(encoded));
    C4_CHECK(encoded.len % 4 == 0);
    size_t wpos = 0;  // the write position
    const char *C4_RESTRICT d = encoded.str;
    constexpr const uint32_t full_byte = 0xff;
    // process every quartet of input 6 bits --> triplet of output bytes
    for(size_t rpos = 0; rpos < encoded.len; rpos += 4, d += 4)
    {
        if(d[2] == '=' || d[3] == '=') // skip the last quartet if it is padded
        {
            C4_ASSERT(d + 4 == encoded.str + encoded.len);
            break;
        }
        uint32_t val = 0;
        c4appendval_(d[3], 0);
        c4appendval_(d[2], 1);
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
        c4append_((val >> (1 * 8)) & full_byte);
        c4append_((val           ) & full_byte);
    }
    // deal with the last quartet when it is padded
    if(d == encoded.str + encoded.len)
        return wpos;
    if(d[2] == '=') // 2 padding chars
    {
        C4_ASSERT(d + 4 == encoded.str + encoded.len);
        C4_ASSERT(d[3] == '=');
        uint32_t val = 0;
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
    }
    else if(d[3] == '=') // 1 padding char
    {
        C4_ASSERT(d + 4 == encoded.str + encoded.len);
        uint32_t val = 0;
        c4appendval_(d[2], 1);
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
        c4append_((val >> (1 * 8)) & full_byte);
    }
    return wpos;
    #undef c4append_
    #undef c4appendval_
}